

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splay.c
# Opt level: O1

Curl_tree * Curl_splaygetbest(curltime i,Curl_tree *t,Curl_tree **removed)

{
  undefined8 uVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 uVar4;
  Curl_tree *pCVar5;
  timediff_t tVar6;
  Curl_tree *pCVar7;
  Curl_tree *pCVar8;
  curltime newer;
  curltime older;
  
  newer.tv_sec = i.tv_sec;
  if (t == (Curl_tree *)0x0) {
    pCVar7 = (Curl_tree *)0x0;
    pCVar8 = (Curl_tree *)0x0;
  }
  else {
    pCVar5 = Curl_splay((curltime)ZEXT816(0),t);
    uVar1 = (pCVar5->key).tv_sec;
    uVar2 = (pCVar5->key).tv_usec;
    older.tv_usec = uVar2;
    older.tv_sec = uVar1;
    newer._8_8_ = i._8_8_ & 0xffffffff;
    older._12_4_ = 0;
    tVar6 = Curl_timediff_us(newer,older);
    pCVar7 = pCVar5;
    pCVar8 = (Curl_tree *)0x0;
    if (-1 < tVar6) {
      pCVar7 = pCVar5->samen;
      pCVar8 = pCVar5;
      if (pCVar7 == pCVar5) {
        pCVar7 = pCVar5->larger;
      }
      else {
        iVar3 = (pCVar5->key).tv_usec;
        uVar4 = *(undefined4 *)&(pCVar5->key).field_0xc;
        (pCVar7->key).tv_sec = (pCVar5->key).tv_sec;
        (pCVar7->key).tv_usec = iVar3;
        *(undefined4 *)&(pCVar7->key).field_0xc = uVar4;
        pCVar7->larger = pCVar5->larger;
        pCVar7->smaller = pCVar5->smaller;
        pCVar7->samep = pCVar5->samep;
        pCVar5->samep->samen = pCVar7;
      }
    }
  }
  *removed = pCVar8;
  return pCVar7;
}

Assistant:

struct Curl_tree *Curl_splaygetbest(struct curltime i,
                                    struct Curl_tree *t,
                                    struct Curl_tree **removed)
{
  static const struct curltime tv_zero = {0, 0};
  struct Curl_tree *x;

  if(!t) {
    *removed = NULL; /* none removed since there was no root */
    return NULL;
  }

  /* find smallest */
  t = Curl_splay(tv_zero, t);
  DEBUGASSERT(t);
  if(compare(i, t->key) < 0) {
    /* even the smallest is too big */
    *removed = NULL;
    return t;
  }

  /* FIRST! Check if there is a list with identical keys */
  x = t->samen;
  if(x != t) {
    /* there is, pick one from the list */

    /* 'x' is the new root node */

    x->key = t->key;
    x->larger = t->larger;
    x->smaller = t->smaller;
    x->samep = t->samep;
    t->samep->samen = x;

    *removed = t;
    return x; /* new root */
  }

  /* we splayed the tree to the smallest element, there is no smaller */
  x = t->larger;
  *removed = t;

  return x;
}